

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::TypeManager::RegisterType(TypeManager *this,uint32_t id,Type *type)

{
  Type *pTVar1;
  mapped_type mVar2;
  bool bVar3;
  uint32_t uVar4;
  mapped_type *ppTVar5;
  mapped_type *pmVar6;
  Type *local_28;
  Type *rebuilt;
  Type *type_local;
  TypeManager *pTStack_10;
  uint32_t id_local;
  TypeManager *this_local;
  
  rebuilt = type;
  type_local._4_4_ = id;
  pTStack_10 = this;
  local_28 = RebuildType(this,id,type);
  bVar3 = analysis::Type::IsSame(local_28,rebuilt);
  pTVar1 = local_28;
  if (!bVar3) {
    __assert_fail("rebuilt->IsSame(&type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x2fb,
                  "void spvtools::opt::analysis::TypeManager::RegisterType(uint32_t, const Type &)")
    ;
  }
  ppTVar5 = std::
            unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
            ::operator[](&this->id_to_type_,(key_type *)((long)&type_local + 4));
  *ppTVar5 = pTVar1;
  uVar4 = GetId(this,local_28);
  mVar2 = type_local._4_4_;
  if (uVar4 == 0) {
    pmVar6 = std::
             unordered_map<const_spvtools::opt::analysis::Type_*,_unsigned_int,_spvtools::opt::analysis::HashTypePointer,_spvtools::opt::analysis::CompareTypePointers,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>_>
             ::operator[](&this->type_to_id_,&local_28);
    *pmVar6 = mVar2;
  }
  return;
}

Assistant:

void TypeManager::RegisterType(uint32_t id, const Type& type) {
  // Rebuild |type| so it and all its constituent types are owned by the type
  // pool.
  Type* rebuilt = RebuildType(id, type);
  assert(rebuilt->IsSame(&type));
  id_to_type_[id] = rebuilt;
  if (GetId(rebuilt) == 0) {
    type_to_id_[rebuilt] = id;
  }
}